

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

word Abc_Tt6Isop(word uOn,word uOnDc,int nVars,int *pnCubes)

{
  ulong uVar1;
  word wVar2;
  word wVar3;
  word wVar4;
  byte bVar5;
  ulong uOnDc_00;
  ulong uVar6;
  ulong uVar7;
  ulong uOnDc_01;
  ulong uVar8;
  int nVars_00;
  
  if (6 < nVars) {
    __assert_fail("nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x900,"word Abc_Tt6Isop(word, word, int, int *)");
  }
  if ((~uOnDc & uOn) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x901,"word Abc_Tt6Isop(word, word, int, int *)");
  }
  if (uOn == 0) {
    wVar4 = 0;
  }
  else if (uOnDc == 0xffffffffffffffff) {
    *pnCubes = *pnCubes + 1;
    wVar4 = 0xffffffffffffffff;
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x909,"word Abc_Tt6Isop(word, word, int, int *)");
    }
    uVar1 = (ulong)(uint)nVars;
    do {
      uVar6 = uVar1;
      if ((long)uVar6 < 1) {
        __assert_fail("Var >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x90e,"word Abc_Tt6Isop(word, word, int, int *)");
      }
      bVar5 = (byte)(1 << ((char)uVar6 - 1U & 0x1f));
    } while (((*(ulong *)(&DAT_00a41738 + uVar6 * 8) & (uOn >> (bVar5 & 0x3f) ^ uOn)) == 0) &&
            (uVar1 = uVar6 - 1,
            (*(ulong *)(&DAT_00a41738 + uVar6 * 8) & (uOnDc >> (bVar5 & 0x3f) ^ uOnDc)) == 0));
    nVars_00 = (int)(uVar6 - 1);
    uVar6 = uVar6 - 1 & 0xffffffff;
    uVar1 = s_Truths6Neg[uVar6];
    uVar6 = s_Truths6[uVar6];
    uVar7 = (uVar1 & uOn) << (bVar5 & 0x3f) | uVar1 & uOn;
    uVar8 = (uVar6 & uOn) >> (bVar5 & 0x3f) | uVar6 & uOn;
    uOnDc_01 = (uVar1 & uOnDc) << (bVar5 & 0x3f) | uVar1 & uOnDc;
    uOnDc_00 = (uOnDc & uVar6) >> (bVar5 & 0x3f) | uOnDc & uVar6;
    wVar2 = Abc_Tt6Isop(~uOnDc_00 & uVar7,uOnDc_01,nVars_00,pnCubes);
    wVar3 = Abc_Tt6Isop(~uOnDc_01 & uVar8,uOnDc_00,nVars_00,pnCubes);
    wVar4 = Abc_Tt6Isop(~wVar3 & uVar8 | ~wVar2 & uVar7,uOnDc_00 & uOnDc_01,nVars_00,pnCubes);
    wVar4 = wVar3 & uVar6 | wVar2 & uVar1 | wVar4;
    if ((~wVar4 & uOn) != 0) {
      __assert_fail("(uOn & ~uRes2) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x91a,"word Abc_Tt6Isop(word, word, int, int *)");
    }
    if ((~uOnDc & wVar4) != 0) {
      __assert_fail("(uRes2 & ~uOnDc) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x91b,"word Abc_Tt6Isop(word, word, int, int *)");
    }
  }
  return wVar4;
}

Assistant:

static inline word Abc_Tt6Isop( word uOn, word uOnDc, int nVars, int * pnCubes )
{
    word uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    int Var;
    assert( nVars <= 6 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
        return 0;
    if ( uOnDc == ~(word)0 )
    {
        (*pnCubes)++;
        return ~(word)0;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( uOn, Var ) || Abc_Tt6HasVar( uOnDc, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = Abc_Tt6Cofactor0( uOn,   Var );
    uOn1   = Abc_Tt6Cofactor1( uOn  , Var );
    uOnDc0 = Abc_Tt6Cofactor0( uOnDc, Var );
    uOnDc1 = Abc_Tt6Cofactor1( uOnDc, Var );
    // solve for cofactors
    uRes0 = Abc_Tt6Isop( uOn0 & ~uOnDc1, uOnDc0, Var, pnCubes );
    uRes1 = Abc_Tt6Isop( uOn1 & ~uOnDc0, uOnDc1, Var, pnCubes );
    uRes2 = Abc_Tt6Isop( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, Var, pnCubes );
    // derive the final truth table
    uRes2 |= (uRes0 & s_Truths6Neg[Var]) | (uRes1 & s_Truths6[Var]);
    assert( (uOn & ~uRes2) == 0 );
    assert( (uRes2 & ~uOnDc) == 0 );
    return uRes2;
}